

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_all(REF_GRID ref_grid)

{
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GRID ref_grid_local;
  
  ref_grid_local._4_4_ = ref_validation_unused_node(ref_grid);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_validation_boundary_face(ref_grid);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = ref_validation_cell_face(ref_grid);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_validation_cell_node(ref_grid);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_validation_cell_volume(ref_grid);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x1d3,"ref_validation_all",(ulong)ref_grid_local._4_4_,"cell volume");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x1d2,"ref_validation_all",(ulong)ref_grid_local._4_4_,"cell node");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x1d1,"ref_validation_all",(ulong)ref_grid_local._4_4_,"cell face");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x1d0,"ref_validation_all",(ulong)ref_grid_local._4_4_,"boundary face");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
           0x1cf,"ref_validation_all",(ulong)ref_grid_local._4_4_,"unused node");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_validation_all(REF_GRID ref_grid) {
  RSS(ref_validation_unused_node(ref_grid), "unused node");
  RSS(ref_validation_boundary_face(ref_grid), "boundary face");
  RSS(ref_validation_cell_face(ref_grid), "cell face");
  RSS(ref_validation_cell_node(ref_grid), "cell node");
  RSS(ref_validation_cell_volume(ref_grid), "cell volume");

  return REF_SUCCESS;
}